

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O2

hrgls_Status hrgls_MessageCreate(hrgls_Message *returnMessage)

{
  hrgls_Message phVar1;
  
  phVar1 = (hrgls_Message)operator_new(0x38);
  (phVar1->value)._M_dataplus._M_p = (pointer)&(phVar1->value).field_2;
  (phVar1->value)._M_string_length = 0;
  (phVar1->value).field_2._M_local_buf[0] = '\0';
  *returnMessage = phVar1;
  return 0;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_MessageCreate(hrgls_Message *returnMessage)
  {
	  hrgls_Status s = hrgls_STATUS_OKAY;
	  hrgls_Message ret;
	  try {
		  ret = new hrgls_Message_;
	  } catch (...) {
		  s = hrgls_STATUS_OUT_OF_MEMORY;
		  ret = nullptr;
	  }
	  *returnMessage = ret;
	  return s;
  }